

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_tx(tftp_state_data_t *state,tftp_event_t event)

{
  char **ppcVar1;
  unsigned_short uVar2;
  Curl_easy *data;
  ushort uVar3;
  CURLcode CVar4;
  undefined8 in_RAX;
  long lVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  curl_off_t size;
  connectdata *pcVar11;
  undefined8 uStack_28;
  int cb;
  
  data = state->conn->data;
  uStack_28 = in_RAX;
  switch(event) {
  case TFTP_EVENT_ACK:
    uVar3 = *(ushort *)((state->rpacket).data + 2);
    uVar3 = uVar3 << 8 | uVar3 >> 8;
    if ((uVar3 != state->block) && ((state->block != 0 || (uVar3 != 0xffff)))) {
      Curl_infof(data,"Received ACK for block %d, expecting %d\n",(ulong)uVar3);
      iVar10 = state->retries;
      state->retries = iVar10 + 1;
      if (state->retry_max <= iVar10) {
        Curl_failf(data,"tftp_tx: giving up waiting for block %d ack",(ulong)state->block);
        return CURLE_SEND_ERROR;
      }
      sVar6 = sendto(state->sockfd,(state->spacket).data,(long)state->sbytes + 4,0x4000,
                     (sockaddr *)&state->remote_addr,state->remote_addrlen);
      if (-1 < sVar6) {
        return CURLE_OK;
      }
      goto LAB_0012de98;
    }
    time(&state->rx_time);
    state->block = state->block + 1;
    break;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    *(state->spacket).data = '\0';
    (state->spacket).data[1] = '\x05';
    uVar2 = state->block;
    (state->spacket).data[2] = (uchar)(uVar2 >> 8);
    (state->spacket).data[3] = (uchar)uVar2;
    sendto(state->sockfd,(state->spacket).data,4,0x4000,(sockaddr *)&state->remote_addr,
           state->remote_addrlen);
    state->state = TFTP_STATE_FIN;
    return CURLE_OK;
  case TFTP_EVENT_OACK:
    state->block = 1;
    break;
  case TFTP_EVENT_TIMEOUT:
    state->retries = state->retries + 1;
    Curl_infof(data,"Timeout waiting for block %d ACK.  Retries = %d\n",
               (ulong)(*(int *)&state->block + 1U & 0xffff));
    if (state->retry_max < state->retries) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
    sVar6 = sendto(state->sockfd,(state->spacket).data,(long)state->sbytes + 4,0x4000,
                   (sockaddr *)&state->remote_addr,state->remote_addrlen);
    if (sVar6 < 0) goto LAB_0012de98;
    size = (data->req).writebytecount;
    goto LAB_0012de2f;
  default:
    Curl_failf(data,"tftp_tx: internal error, event: %i");
    return CURLE_OK;
  }
  state->retries = 0;
  *(state->spacket).data = '\0';
  (state->spacket).data[1] = '\x03';
  uVar2 = state->block;
  (state->spacket).data[2] = (uchar)(uVar2 >> 8);
  (state->spacket).data[3] = (uchar)uVar2;
  if (state->block < 2) {
    iVar10 = state->blksize;
  }
  else {
    iVar10 = state->blksize;
    if (state->sbytes < iVar10) {
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }
  }
  state->sbytes = 0;
  pcVar11 = state->conn;
  (pcVar11->data->req).upload_fromhere = (char *)((state->spacket).data + 4);
  lVar9 = 0;
  do {
    CVar4 = Curl_fillreadbuffer(pcVar11,iVar10 - (int)lVar9,&cb);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    lVar5 = (long)cb;
    lVar9 = state->sbytes + lVar5;
    state->sbytes = (int)lVar9;
    pcVar11 = state->conn;
    ppcVar1 = &(pcVar11->data->req).upload_fromhere;
    *ppcVar1 = *ppcVar1 + lVar5;
  } while ((lVar5 != 0) && (iVar10 = state->blksize, (int)lVar9 < iVar10));
  sVar6 = sendto(state->sockfd,(state->spacket).data,lVar9 + 4,0x4000,
                 (sockaddr *)&state->remote_addr,state->remote_addrlen);
  if (sVar6 < 0) {
LAB_0012de98:
    pcVar11 = state->conn;
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(pcVar11,*piVar7);
    Curl_failf(data,"%s",pcVar8);
    return CURLE_SEND_ERROR;
  }
  size = (long)state->sbytes + (data->req).writebytecount;
  (data->req).writebytecount = size;
LAB_0012de2f:
  Curl_pgrsSetUploadCounter(data,size);
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_tx(tftp_state_data_t *state, tftp_event_t event)
{
  struct Curl_easy *data = state->conn->data;
  ssize_t sbytes;
  int rblock;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int cb; /* Bytes currently read */

  switch(event) {

  case TFTP_EVENT_ACK:
  case TFTP_EVENT_OACK:
    if(event == TFTP_EVENT_ACK) {
      /* Ack the packet */
      rblock = getrpacketblock(&state->rpacket);

      if(rblock != state->block &&
         /* There's a bug in tftpd-hpa that causes it to send us an ack for
          * 65535 when the block number wraps to 0. So when we're expecting
          * 0, also accept 65535. See
          * http://syslinux.zytor.com/archives/2010-September/015253.html
          * */
         !(state->block == 0 && rblock == 65535)) {
        /* This isn't the expected block.  Log it and up the retry counter */
        infof(data, "Received ACK for block %d, expecting %d\n",
              rblock, state->block);
        state->retries++;
        /* Bail out if over the maximum */
        if(state->retries>state->retry_max) {
          failf(data, "tftp_tx: giving up waiting for block %d ack",
                state->block);
          result = CURLE_SEND_ERROR;
        }
        else {
          /* Re-send the data packet */
          sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                          4 + state->sbytes, SEND_4TH_ARG,
                          (struct sockaddr *)&state->remote_addr,
                          state->remote_addrlen);
          /* Check all sbytes were sent */
          if(sbytes<0) {
            failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
            result = CURLE_SEND_ERROR;
          }
        }

        return result;
      }
      /* This is the expected packet.  Reset the counters and send the next
         block */
      time(&state->rx_time);
      state->block++;
    }
    else
      state->block = 1; /* first data block is 1 when using OACK */

    state->retries = 0;
    setpacketevent(&state->spacket, TFTP_EVENT_DATA);
    setpacketblock(&state->spacket, state->block);
    if(state->block > 1 && state->sbytes < (int)state->blksize) {
      state->state = TFTP_STATE_FIN;
      return CURLE_OK;
    }

    /* TFTP considers data block size < 512 bytes as an end of session. So
     * in some cases we must wait for additional data to build full (512 bytes)
     * data block.
     * */
    state->sbytes = 0;
    state->conn->data->req.upload_fromhere = (char *)state->spacket.data + 4;
    do {
      result = Curl_fillreadbuffer(state->conn, state->blksize - state->sbytes,
                                   &cb);
      if(result)
        return result;
      state->sbytes += cb;
      state->conn->data->req.upload_fromhere += cb;
    } while(state->sbytes < state->blksize && cb != 0);

    sbytes = sendto(state->sockfd, (void *) state->spacket.data,
                    4 + state->sbytes, SEND_4TH_ARG,
                    (struct sockaddr *)&state->remote_addr,
                    state->remote_addrlen);
    /* Check all sbytes were sent */
    if(sbytes<0) {
      failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
      return CURLE_SEND_ERROR;
    }
    /* Update the progress meter */
    k->writebytecount += state->sbytes;
    Curl_pgrsSetUploadCounter(data, k->writebytecount);
    break;

  case TFTP_EVENT_TIMEOUT:
    /* Increment the retry counter and log the timeout */
    state->retries++;
    infof(data, "Timeout waiting for block %d ACK. "
          " Retries = %d\n", NEXT_BLOCKNUM(state->block), state->retries);
    /* Decide if we've had enough */
    if(state->retries > state->retry_max) {
      state->error = TFTP_ERR_TIMEOUT;
      state->state = TFTP_STATE_FIN;
    }
    else {
      /* Re-send the data packet */
      sbytes = sendto(state->sockfd, (void *)state->spacket.data,
                      4 + state->sbytes, SEND_4TH_ARG,
                      (struct sockaddr *)&state->remote_addr,
                      state->remote_addrlen);
      /* Check all sbytes were sent */
      if(sbytes<0) {
        failf(data, "%s", Curl_strerror(state->conn, SOCKERRNO));
        return CURLE_SEND_ERROR;
      }
      /* since this was a re-send, we remain at the still byte position */
      Curl_pgrsSetUploadCounter(data, k->writebytecount);
    }
    break;

  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    setpacketevent(&state->spacket, TFTP_EVENT_ERROR);
    setpacketblock(&state->spacket, state->block);
    (void)sendto(state->sockfd, (void *)state->spacket.data, 4, SEND_4TH_ARG,
                 (struct sockaddr *)&state->remote_addr,
                 state->remote_addrlen);
    /* don't bother with the return code, but if the socket is still up we
     * should be a good TFTP client and let the server know we're done */
    state->state = TFTP_STATE_FIN;
    break;

  default:
    failf(data, "tftp_tx: internal error, event: %i", (int)(event));
    break;
  }

  return result;
}